

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllContentModel.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AllContentModel::AllContentModel
          (AllContentModel *this,ContentSpecNode *parentContentSpec,bool isMixed,
          MemoryManager *manager)

{
  NodeTypes NVar1;
  int iVar2;
  RuntimeException *this_00;
  XMLSize_t XVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  QName *this_01;
  QName **ppQVar4;
  bool *pbVar5;
  uint local_94;
  uint index;
  ContentSpecNode *curNode;
  ValueVectorOf<bool> childOptional;
  undefined1 local_50 [8];
  ValueVectorOf<xercesc_4_0::QName_*> children;
  MemoryManager *manager_local;
  bool isMixed_local;
  ContentSpecNode *parentContentSpec_local;
  AllContentModel *this_local;
  
  children.fMemoryManager = manager;
  XMLContentModel::XMLContentModel(&this->super_XMLContentModel);
  (this->super_XMLContentModel)._vptr_XMLContentModel = (_func_int **)&PTR__AllContentModel_00533848
  ;
  this->fMemoryManager = children.fMemoryManager;
  this->fCount = 0;
  this->fChildren = (QName **)0x0;
  this->fChildOptional = (bool *)0x0;
  this->fNumRequired = 0;
  this->fIsMixed = isMixed;
  this->fHasOptionalContent = false;
  ValueVectorOf<xercesc_4_0::QName_*>::ValueVectorOf
            ((ValueVectorOf<xercesc_4_0::QName_*> *)local_50,0x40,this->fMemoryManager,false);
  ValueVectorOf<bool>::ValueVectorOf
            ((ValueVectorOf<bool> *)&curNode,0x40,this->fMemoryManager,false);
  if (parentContentSpec == (ContentSpecNode *)0x0) {
    this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/AllContentModel.cpp"
               ,0x44,CM_NoParentCSN,this->fMemoryManager);
    __cxa_throw(this_00,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
  }
  NVar1 = ContentSpecNode::getType(parentContentSpec);
  if (NVar1 == All) {
    iVar2 = ContentSpecNode::getMinOccurs(parentContentSpec);
    if (iVar2 == 0) {
      this->fHasOptionalContent = true;
    }
  }
  buildChildList(this,parentContentSpec,(ValueVectorOf<xercesc_4_0::QName_*> *)local_50,
                 (ValueVectorOf<bool> *)&curNode);
  XVar3 = ValueVectorOf<xercesc_4_0::QName_*>::size((ValueVectorOf<xercesc_4_0::QName_*> *)local_50)
  ;
  this->fCount = XVar3;
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,this->fCount << 3);
  this->fChildren = (QName **)CONCAT44(extraout_var,iVar2);
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,this->fCount);
  this->fChildOptional = (bool *)CONCAT44(extraout_var_00,iVar2);
  for (local_94 = 0; (ulong)local_94 < this->fCount; local_94 = local_94 + 1) {
    this_01 = (QName *)XMemory::operator_new(0x48,this->fMemoryManager);
    ppQVar4 = ValueVectorOf<xercesc_4_0::QName_*>::elementAt
                        ((ValueVectorOf<xercesc_4_0::QName_*> *)local_50,(ulong)local_94);
    QName::QName(this_01,*ppQVar4);
    this->fChildren[local_94] = this_01;
    pbVar5 = ValueVectorOf<bool>::elementAt((ValueVectorOf<bool> *)&curNode,(ulong)local_94);
    this->fChildOptional[local_94] = (bool)(*pbVar5 & 1);
  }
  ValueVectorOf<bool>::~ValueVectorOf((ValueVectorOf<bool> *)&curNode);
  ValueVectorOf<xercesc_4_0::QName_*>::~ValueVectorOf
            ((ValueVectorOf<xercesc_4_0::QName_*> *)local_50);
  return;
}

Assistant:

AllContentModel::AllContentModel( ContentSpecNode* const parentContentSpec
                                , const bool             isMixed
                                , MemoryManager* const   manager) :
   fMemoryManager(manager)
 , fCount(0)
 , fChildren(0)
 , fChildOptional(0)
 , fNumRequired(0)
 , fIsMixed(isMixed)
 , fHasOptionalContent(false)
{
    //
    //  Create a vector of unsigned ints that will be filled in with the
    //  ids of the child nodes. It will be expanded as needed but we give
    //  it an initial capacity of 64 which should be more than enough for
    //  99% of the scenarios.
    //

    ValueVectorOf<QName*> children(64, fMemoryManager);
    ValueVectorOf<bool> childOptional(64, fMemoryManager);

    //
    //  Get the parent element's content spec. This is the head of the tree
    //  of nodes that describes the content model. We will iterate this
    //  tree.
    //
    ContentSpecNode* curNode = parentContentSpec;
    if (!curNode)
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_NoParentCSN, fMemoryManager);

    // And now call the private recursive method that iterates the tree
    if (curNode->getType() == ContentSpecNode::All
        && curNode->getMinOccurs() == 0) {
        fHasOptionalContent = true;
    }
    buildChildList(curNode, children, childOptional);

    //
    //  And now we know how many elements we need in our member list. So
    //  fill them in.
    //
    fCount = children.size();
    fChildren = (QName**) fMemoryManager->allocate(fCount * sizeof(QName*)); //new QName*[fCount];
    fChildOptional = (bool*) fMemoryManager->allocate(fCount * sizeof(bool)); //new bool[fCount];
    for (unsigned int index = 0; index < fCount; index++) {
        fChildren[index] = new (fMemoryManager) QName(*(children.elementAt(index)));
        fChildOptional[index] = childOptional.elementAt(index);
    }
}